

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Supp_Man_t * Supp_ManStart(int nChunkSize,int nStepSize)

{
  Supp_Man_t *pSVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  pSVar1 = (Supp_Man_t *)malloc(0x28);
  pSVar1->nChunkSize = 0;
  pSVar1->nStepSize = 0;
  pSVar1->pFreeBuf = (char *)0x0;
  *(undefined8 *)&pSVar1->nFreeSize = 0;
  pSVar1->vMemory = (Vec_Ptr_t *)0x0;
  pSVar1->vFree = (Vec_Ptr_t *)0x0;
  pSVar1->nChunkSize = nChunkSize;
  pSVar1->nStepSize = nStepSize;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pSVar1->vMemory = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pSVar1->vFree = pVVar2;
  return pSVar1;
}

Assistant:

Supp_Man_t * Supp_ManStart( int nChunkSize, int nStepSize )
{
    Supp_Man_t * p;
    p = ABC_ALLOC( Supp_Man_t, 1 );
    memset( p, 0, sizeof(Supp_Man_t) );
    p->nChunkSize = nChunkSize;
    p->nStepSize  = nStepSize;
    p->vMemory    = Vec_PtrAlloc( 1000 );
    p->vFree      = Vec_PtrAlloc( 1000 );
    return p;
}